

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O3

BackgroundProjections ON_Environment::ProjectionFromString(wchar_t *wsz)

{
  int iVar1;
  BackgroundProjections BVar2;
  
  iVar1 = on_wcsicmp(L"planar",wsz);
  if (iVar1 == 0) {
    BVar2 = Planar;
  }
  else {
    iVar1 = on_wcsicmp(L"spherical",wsz);
    if (iVar1 == 0) {
      BVar2 = Spherical;
    }
    else {
      iVar1 = on_wcsicmp(L"emap",wsz);
      if (iVar1 == 0) {
        BVar2 = Emap;
      }
      else {
        iVar1 = on_wcsicmp(L"box",wsz);
        if (iVar1 == 0) {
          BVar2 = Box;
        }
        else {
          iVar1 = on_wcsicmp(L"lightprobe",wsz);
          if (iVar1 == 0) {
            BVar2 = LightProbe;
          }
          else {
            iVar1 = on_wcsicmp(L"cubemap",wsz);
            if (iVar1 == 0) {
              BVar2 = CubeMap;
            }
            else {
              iVar1 = on_wcsicmp(L"vertical-cross-cubemap",wsz);
              if (iVar1 == 0) {
                BVar2 = VerticalCrossCubeMap;
              }
              else {
                iVar1 = on_wcsicmp(L"horizontal-cross-cubemap",wsz);
                if (iVar1 == 0) {
                  BVar2 = HorizontalCrossCubeMap;
                }
                else {
                  iVar1 = on_wcsicmp(L"hemispherical",wsz);
                  if (iVar1 == 0) {
                    BVar2 = Hemispherical;
                  }
                  else {
                    BVar2 = Planar;
                    ON_REMOVE_ASAP_AssertEx
                              (0,
                               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_render_content.cpp"
                               ,0xc1,"","false is false");
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return BVar2;
}

Assistant:

ON_Environment::BackgroundProjections ON_Environment::ProjectionFromString(const wchar_t* wsz) // Static.
{
  if (0 == on_wcsicmp(ON_ENVIRONMENT_PROJECTION_PLANAR, wsz))        return BackgroundProjections::Planar;
  if (0 == on_wcsicmp(ON_ENVIRONMENT_PROJECTION_SPHERICAL, wsz))     return BackgroundProjections::Spherical;
  if (0 == on_wcsicmp(ON_ENVIRONMENT_PROJECTION_EMAP, wsz))          return BackgroundProjections::Emap;
  if (0 == on_wcsicmp(ON_ENVIRONMENT_PROJECTION_BOX, wsz))           return BackgroundProjections::Box;
  if (0 == on_wcsicmp(ON_ENVIRONMENT_PROJECTION_LIGHT_PROBE, wsz))   return BackgroundProjections::LightProbe;
  if (0 == on_wcsicmp(ON_ENVIRONMENT_PROJECTION_CUBE_MAP, wsz))      return BackgroundProjections::CubeMap;
  if (0 == on_wcsicmp(ON_ENVIRONMENT_PROJECTION_CUBE_MAP_VERT, wsz)) return BackgroundProjections::VerticalCrossCubeMap;
  if (0 == on_wcsicmp(ON_ENVIRONMENT_PROJECTION_CUBE_MAP_HORZ, wsz)) return BackgroundProjections::HorizontalCrossCubeMap;
  if (0 == on_wcsicmp(ON_ENVIRONMENT_PROJECTION_HEMISPHERICAL, wsz)) return BackgroundProjections::Hemispherical;

  ON_ASSERT(false);
  return BackgroundProjections::Planar;
}